

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_config(unqlite *pDb,int nConfigOp,...)

{
  jx9 *pjVar1;
  int iVar2;
  uint uVar3;
  undefined8 *in_RDX;
  va_list ap;
  undefined8 *local_b8;
  uint *local_b0;
  
  if (pDb == (unqlite *)0x0) {
    return -0x18;
  }
  if (pDb->nMagic != 0xdb7c2712) {
    return -0x18;
  }
  iVar2 = -0xd;
  switch(nConfigOp) {
  case 1:
    if (in_RDX == (undefined8 *)0x0) {
      return -0x18;
    }
    pjVar1 = (pDb->sDB).pJx9;
    SyBlobNullAppend(&(pjVar1->xConf).sErrConsumer);
    *in_RDX = (pjVar1->xConf).sErrConsumer.pBlob;
    if (local_b0 != (uint *)0x0) {
      uVar3 = (pjVar1->xConf).sErrConsumer.nByte;
      if (uVar3 < 2) {
        uVar3 = 0;
      }
      *local_b0 = uVar3;
      return 0;
    }
    break;
  case 2:
    if ((int)(sxu32)local_b8 < 0x100) {
      return -9;
    }
    ((pDb->sDB).pPager)->nCacheMax = (sxu32)local_b8;
    break;
  case 3:
    if (in_RDX == (undefined8 *)0x0) {
      return -0x18;
    }
    SyBlobNullAppend(&pDb->sErr);
    *in_RDX = (pDb->sErr).pBlob;
    if (local_b0 != (uint *)0x0) {
      uVar3 = (pDb->sErr).nByte;
      if (uVar3 < 2) {
        *local_b0 = 0;
        return 0;
      }
      *local_b0 = uVar3;
      return 0;
    }
    return 0;
  default:
    goto switchD_0010b501_caseD_4;
  case 5:
    *(byte *)&pDb->iFlags = (byte)pDb->iFlags | 1;
    break;
  case 6:
    iVar2 = 0;
    if (local_b8 != (undefined8 *)0x0) {
      *local_b8 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->zName;
    }
    goto switchD_0010b501_caseD_4;
  }
  iVar2 = 0;
switchD_0010b501_caseD_4:
  return iVar2;
}

Assistant:

int unqlite_config(unqlite *pDb,int nConfigOp,...)
{
	va_list ap;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 va_start(ap, nConfigOp);
	 rc = unqliteConfigure(&(*pDb),nConfigOp, ap);
	 va_end(ap);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}